

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::FixIndentation::params
          (FixIndentation *this,Fodder *fodder_l,ArgParams *params,bool trailing_comma,
          Fodder *fodder_r,Indent *indent)

{
  uint line_up;
  pointer pAVar1;
  Fodder *fodder;
  bool bVar2;
  Indent new_indent;
  
  fill(this,fodder_l,false,false,indent->lineUp,indent->lineUp);
  line_up = this->column + 1;
  this->column = line_up;
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((params->
      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>)
      ._M_impl.super__Vector_impl_data._M_finish == pAVar1) {
    pAVar1 = (pointer)fodder_r;
  }
  new_indent = newIndent(this,&pAVar1->idFodder,indent,line_up);
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (fodder = &((params->
                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  )._M_impl.super__Vector_impl_data._M_start)->commaFodder;
      (pointer)((long)(fodder + -3) + 8) != pAVar1; fodder = (Fodder *)((long)(fodder + 3) + 0x10))
  {
    if (!bVar2) {
      this->column = this->column + 1;
    }
    fill(this,(Fodder *)((long)(fodder + -3) + 8),(bool)(~bVar2 & 1),true,new_indent.lineUp);
    this->column = this->column + *(int *)(*(long *)((long)(fodder + -2) + 8) + 8);
    if (*(long *)((long)(fodder + -1) + 0x10) != 0) {
      fill(this,(Fodder *)((long)(fodder + -2) + 0x10),false,false,new_indent.lineUp);
      this->column = this->column + 1;
      expr(this,*(AST **)((long)(fodder + -1) + 0x10),&new_indent,false);
    }
    bVar2 = false;
    fill(this,fodder,false,false,new_indent.lineUp);
  }
  if (trailing_comma) {
    this->column = this->column + 1;
  }
  fill(this,fodder_r,false,false,new_indent.lineUp,indent->lineUp);
  this->column = this->column + 1;
  return;
}

Assistant:

void params(Fodder &fodder_l, ArgParams &params, bool trailing_comma, Fodder &fodder_r,
                const Indent &indent)
    {
        fill(fodder_l, false, false, indent.lineUp, indent.lineUp);
        column++;  // (
        const Fodder &first_inside = params.size() == 0 ? fodder_r : params[0].idFodder;

        Indent new_indent = newIndent(first_inside, indent, column);
        bool first = true;
        for (auto &param : params) {
            if (!first)
                column++;  // ','
            fill(param.idFodder, !first, true, new_indent.lineUp);
            column += param.id->name.length();
            if (param.expr != nullptr) {
                // default arg, no spacing: x=e
                fill(param.eqFodder, false, false, new_indent.lineUp);
                column++;
                expr(param.expr, new_indent, false);
            }
            fill(param.commaFodder, false, false, new_indent.lineUp);
            first = false;
        }
        if (trailing_comma)
            column++;
        fill(fodder_r, false, false, new_indent.lineUp, indent.lineUp);
        column++;  // )
    }